

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O3

bool __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::matchCurrency
          (CombinedCurrencyMatcher *this,StringSegment *segment,ParsedNumber *result,
          UErrorCode *status)

{
  short sVar1;
  UErrorCode *pUVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t longestFullMatch;
  UnicodeString *name;
  UnicodeString *other;
  long lVar8;
  bool bVar9;
  bool bVar10;
  int32_t partialMatchLen;
  ParsePosition ppos;
  UnicodeString segmentString;
  int32_t local_8c;
  ParsePosition local_88;
  UErrorCode *local_78;
  UnicodeString local_70;
  
  iVar3 = -1;
  local_78 = status;
  if (0x1f < (ushort)(this->fCurrency1).fUnion.fStackFields.fLengthAndFlags) {
    iVar3 = StringSegment::getCaseSensitivePrefixLength(segment,&this->fCurrency1);
  }
  iVar4 = StringSegment::length(segment);
  bVar9 = iVar3 == iVar4;
  sVar1 = (this->fCurrency1).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar5 = (this->fCurrency1).fUnion.fFields.fLength;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
  }
  if (iVar3 == iVar5) {
    result->currencyCode[2] = this->fCurrencyCode[2];
    *(undefined4 *)result->currencyCode = *(undefined4 *)this->fCurrencyCode;
    result->currencyCode[3] = L'\0';
    StringSegment::adjustOffset(segment,iVar3);
  }
  else {
    iVar5 = -1;
    if (0x1f < (ushort)(this->fCurrency2).fUnion.fStackFields.fLengthAndFlags) {
      iVar5 = StringSegment::getCommonPrefixLength(segment,&this->fCurrency2);
    }
    bVar9 = true;
    if (iVar3 != iVar4) {
      iVar3 = StringSegment::length(segment);
      bVar9 = iVar5 == iVar3;
    }
    sVar1 = (this->fCurrency2).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (this->fCurrency2).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    if (iVar5 != iVar6) {
      if (this->fUseFullCurrencyData != false) {
        StringSegment::toTempUnicodeString(&local_70,segment);
        pUVar2 = local_78;
        local_88.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003eafd8;
        local_88.index = 0;
        local_88.errorIndex = -1;
        local_8c = 0;
        uprv_parseCurrency_63
                  ((this->fLocaleName).buffer.ptr,&local_70,&local_88,'\0',&local_8c,
                   result->currencyCode,local_78);
        iVar3 = local_8c;
        bVar10 = true;
        if (bVar9 == false) {
          iVar4 = StringSegment::length(segment);
          bVar10 = iVar3 == iVar4;
        }
        if ((*pUVar2 < U_ILLEGAL_ARGUMENT_ERROR) && (local_88.index != 0)) {
          StringSegment::adjustOffset(segment,local_88.index);
          ParsedNumber::setCharsConsumed(result,segment);
        }
        ParsePosition::~ParsePosition(&local_88);
        UnicodeString::~UnicodeString(&local_70);
        return bVar10;
      }
      other = (UnicodeString *)&this->field_0x98;
      iVar5 = 0;
      lVar8 = 6;
      do {
        iVar3 = StringSegment::getCommonPrefixLength(segment,other);
        sVar1 = (other->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (other->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        iVar7 = iVar5;
        if (iVar5 < iVar6) {
          iVar7 = iVar6;
        }
        if (iVar3 == iVar6) {
          iVar5 = iVar7;
        }
        bVar9 = (bool)(bVar9 | 0 < iVar3);
        other = other + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      if (iVar5 < 1) {
        return bVar9;
      }
    }
    result->currencyCode[2] = this->fCurrencyCode[2];
    *(undefined4 *)result->currencyCode = *(undefined4 *)this->fCurrencyCode;
    result->currencyCode[3] = L'\0';
    StringSegment::adjustOffset(segment,iVar5);
  }
  ParsedNumber::setCharsConsumed(result,segment);
  return bVar9;
}

Assistant:

bool CombinedCurrencyMatcher::matchCurrency(StringSegment& segment, ParsedNumber& result,
                                            UErrorCode& status) const {
    bool maybeMore = false;

    int32_t overlap1;
    if (!fCurrency1.isEmpty()) {
        overlap1 = segment.getCaseSensitivePrefixLength(fCurrency1);
    } else {
        overlap1 = -1;
    }
    maybeMore = maybeMore || overlap1 == segment.length();
    if (overlap1 == fCurrency1.length()) {
        utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
        segment.adjustOffset(overlap1);
        result.setCharsConsumed(segment);
        return maybeMore;
    }

    int32_t overlap2;
    if (!fCurrency2.isEmpty()) {
        // ISO codes should be accepted case-insensitive.
        // https://unicode-org.atlassian.net/browse/ICU-13696
        overlap2 = segment.getCommonPrefixLength(fCurrency2);
    } else {
        overlap2 = -1;
    }
    maybeMore = maybeMore || overlap2 == segment.length();
    if (overlap2 == fCurrency2.length()) {
        utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
        segment.adjustOffset(overlap2);
        result.setCharsConsumed(segment);
        return maybeMore;
    }

    if (fUseFullCurrencyData) {
        // Use the full currency data.
        // NOTE: This call site should be improved with #13584.
        const UnicodeString segmentString = segment.toTempUnicodeString();

        // Try to parse the currency
        ParsePosition ppos(0);
        int32_t partialMatchLen = 0;
        uprv_parseCurrency(
                fLocaleName.data(),
                segmentString,
                ppos,
                UCURR_SYMBOL_NAME, // checks for both UCURR_SYMBOL_NAME and UCURR_LONG_NAME
                &partialMatchLen,
                result.currencyCode,
                status);
        maybeMore = maybeMore || partialMatchLen == segment.length();

        if (U_SUCCESS(status) && ppos.getIndex() != 0) {
            // Complete match.
            // NOTE: The currency code should already be saved in the ParsedNumber.
            segment.adjustOffset(ppos.getIndex());
            result.setCharsConsumed(segment);
            return maybeMore;
        }

    } else {
        // Use the locale long names.
        int32_t longestFullMatch = 0;
        for (int32_t i=0; i<StandardPlural::COUNT; i++) {
            const UnicodeString& name = fLocalLongNames[i];
            int32_t overlap = segment.getCommonPrefixLength(name);
            if (overlap == name.length() && name.length() > longestFullMatch) {
                longestFullMatch = name.length();
            }
            maybeMore = maybeMore || overlap > 0;
        }
        if (longestFullMatch > 0) {
            utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
            segment.adjustOffset(longestFullMatch);
            result.setCharsConsumed(segment);
            return maybeMore;
        }
    }

    // No match found.
    return maybeMore;
}